

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O1

string * __thiscall
cmExportInstallFileGenerator::GetFileSetFiles_abi_cxx11_
          (string *__return_storage_ptr__,cmExportInstallFileGenerator *this,cmGeneratorTarget *gte,
          cmFileSet *fileSet,cmTargetExport *te)

{
  pointer pcVar1;
  _Base_ptr p_Var2;
  cmMakefile *this_00;
  cmFileSet *pcVar3;
  _Alloc_hider _Var4;
  int iVar5;
  mapped_type *ppcVar6;
  string *psVar7;
  _Rb_tree_node_base *p_Var8;
  ostream *poVar9;
  long *plVar10;
  pointer puVar11;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  *puVar12;
  char cVar13;
  long *plVar14;
  size_type sVar15;
  long lVar16;
  _Base_ptr p_Var17;
  undefined8 uVar18;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  *entry;
  pointer cge;
  _Base_ptr filename;
  bool bVar19;
  bool bVar20;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_04;
  string_view str;
  string_view str_00;
  string_view separator;
  string prefix;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  destCge;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  string escapedFile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  resultVector;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  fileEntries;
  string relFile;
  string dest;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  files;
  cmGeneratorExpression destGe;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  directoryEntries;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  directories;
  ostringstream e;
  cmFileSet *local_3d8;
  undefined1 local_3d0 [48];
  string local_3a0;
  string *local_380;
  cmGeneratorTarget *local_378;
  string *local_370;
  undefined1 local_368 [16];
  string *local_358;
  string local_348;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_328;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  local_310;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_278;
  cmExportInstallFileGenerator *local_270;
  string *local_268;
  _Rb_tree_node_base *local_260;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_258;
  undefined1 local_228 [40];
  undefined1 local_200 [32];
  long *local_1e0 [2];
  long local_1d0 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c0;
  basic_string_view<char,_std::char_traits<char>_> local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  undefined8 local_188;
  char *local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_178;
  pointer local_170;
  undefined8 local_168;
  char *local_160;
  ios_base local_138 [264];
  
  local_328.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_328.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_328.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3d8 = fileSet;
  local_380 = __return_storage_ptr__;
  local_378 = gte;
  local_270 = this;
  cmMakefile::GetGeneratorConfigs_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_368 + 8),gte->Makefile,IncludeEmptyConfig);
  cmFileSet::CompileFileEntries(&local_310,local_3d8);
  cmFileSet::CompileDirectoryEntries
            ((vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
              *)(local_228 + 0x10),local_3d8);
  local_288.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_288.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_288);
  cmGeneratorExpression::cmGeneratorExpression
            ((cmGeneratorExpression *)local_228,(cmListFileBacktrace *)&local_288);
  if (local_288.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_288.TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  ppcVar6 = std::
            map<cmFileSet_*,_cmInstallFileSetGenerator_*,_std::less<cmFileSet_*>,_std::allocator<std::pair<cmFileSet_*const,_cmInstallFileSetGenerator_*>_>_>
            ::at(&te->FileSetGenerators,&local_3d8);
  pcVar1 = ((*ppcVar6)->super_cmInstallGenerator).Destination._M_dataplus._M_p;
  local_1e0[0] = local_1d0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1e0,pcVar1,
             pcVar1 + ((*ppcVar6)->super_cmInstallGenerator).Destination._M_string_length);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)local_368,(string *)local_228);
  if (local_1e0[0] != local_1d0) {
    operator_delete(local_1e0[0],local_1d0[0] + 1);
  }
  local_268 = local_358;
  if ((string *)local_368._8_8_ != local_358) {
    local_278 = &local_380->field_2;
    psVar7 = (string *)local_368._8_8_;
    do {
      local_370 = psVar7;
      cmFileSet::EvaluateDirectoryEntries
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(local_1d0 + 2),local_3d8,
                 (vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                  *)(local_228 + 0x10),local_378->LocalGenerator,psVar7,local_378,
                 (cmGeneratorExpressionDAGChecker *)0x0);
      puVar11 = local_310.
                super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      local_258._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_258._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_258._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_258._M_impl.super__Rb_tree_header._M_header;
      local_258._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_258._M_impl.super__Rb_tree_header._M_header._M_right =
           local_258._M_impl.super__Rb_tree_header._M_header._M_left;
      for (cge = local_310.
                 super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; cge != puVar11; cge = cge + 1) {
        cmFileSet::EvaluateFileEntry
                  (local_3d8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(local_1d0 + 2),
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                    *)&local_258,cge,local_378->LocalGenerator,local_370,local_378,
                   (cmGeneratorExpressionDAGChecker *)0x0);
      }
      local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
      local_3a0._M_string_length = 0;
      local_3a0.field_2._M_local_buf[0] = '\0';
      uVar18 = 0;
      psVar7 = cmCompiledGeneratorExpression::Evaluate
                         ((cmCompiledGeneratorExpression *)local_368._0_8_,local_378->LocalGenerator
                          ,local_370,local_378,(cmGeneratorExpressionDAGChecker *)0x0,
                          (cmGeneratorTarget *)0x0,&local_3a0);
      str._M_str = &DAT_00000001;
      str._M_len = (size_t)(psVar7->_M_dataplus)._M_p;
      cmOutputConverter::EscapeForCMake_abi_cxx11_
                (&local_2b8,(cmOutputConverter *)psVar7->_M_string_length,str,(WrapQuotes)uVar18);
      local_1a8._M_len = 0x12;
      local_1a8._M_str = "${_IMPORT_PREFIX}/";
      local_198._M_allocated_capacity = local_2b8._M_string_length;
      local_198._8_8_ = local_2b8._M_dataplus._M_p;
      local_3d0._0_8_ = &DAT_00000001;
      local_3d0._8_8_ = local_3d0 + 0x10;
      local_3d0[0x10] = 0x2f;
      local_188 = 1;
      views._M_len = 3;
      views._M_array = &local_1a8;
      local_180 = (char *)local_3d0._8_8_;
      cmCatViews_abi_cxx11_(&local_2d8,views);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,
                        CONCAT71(local_2b8.field_2._M_allocated_capacity._1_7_,
                                 local_2b8.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
        operator_delete(local_3a0._M_dataplus._M_p,
                        CONCAT71(local_3a0.field_2._M_allocated_capacity._1_7_,
                                 local_3a0.field_2._M_local_buf[0]) + 1);
      }
      pcVar3 = local_3d8;
      bVar19 = true;
      if (*(bool *)(local_368._0_8_ + 0x130) == false) {
        lVar16 = (long)(local_228._24_8_ - local_228._16_8_) >> 5;
        plVar14 = (long *)local_228._16_8_;
        if (0 < lVar16) {
          plVar14 = (long *)((local_228._24_8_ - local_228._16_8_ & 0xffffffffffffffe0) +
                            local_228._16_8_);
          lVar16 = lVar16 + 1;
          plVar10 = (long *)(local_228._16_8_ + 0x10);
          do {
            if (*(char *)(plVar10[-2] + 0x130) != '\0') {
              plVar10 = plVar10 + -2;
              goto LAB_004a8ec7;
            }
            if (*(char *)(plVar10[-1] + 0x130) != '\0') {
              plVar10 = plVar10 + -1;
              goto LAB_004a8ec7;
            }
            if (*(char *)(*plVar10 + 0x130) != '\0') goto LAB_004a8ec7;
            if (*(char *)(plVar10[1] + 0x130) != '\0') {
              plVar10 = plVar10 + 1;
              goto LAB_004a8ec7;
            }
            lVar16 = lVar16 + -1;
            plVar10 = plVar10 + 4;
          } while (1 < lVar16);
        }
        lVar16 = local_228._24_8_ - (long)plVar14 >> 3;
        if (lVar16 == 1) {
LAB_004a8ea4:
          plVar10 = plVar14;
          if (*(char *)(*plVar14 + 0x130) == '\0') {
            plVar10 = (long *)local_228._24_8_;
          }
        }
        else if (lVar16 == 2) {
LAB_004a8e94:
          plVar10 = plVar14;
          if (*(char *)(*plVar14 + 0x130) == '\0') {
            plVar14 = plVar14 + 1;
            goto LAB_004a8ea4;
          }
        }
        else {
          plVar10 = (long *)local_228._24_8_;
          if ((lVar16 == 3) && (plVar10 = plVar14, *(char *)(*plVar14 + 0x130) == '\0')) {
            plVar14 = plVar14 + 1;
            goto LAB_004a8e94;
          }
        }
LAB_004a8ec7:
        if (plVar10 == (long *)local_228._24_8_) {
          lVar16 = (long)local_310.
                         super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_310.
                         super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5;
          puVar11 = local_310.
                    super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (0 < lVar16) {
            puVar11 = (pointer)((long)&((local_310.
                                         super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                       super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                                       .
                                       super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>
                                       ._M_head_impl +
                               ((long)local_310.
                                      super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_310.
                                      super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start &
                               0xffffffffffffffe0U));
            lVar16 = lVar16 + 1;
            puVar12 = local_310.
                      super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 2;
            do {
              if ((puVar12[-2]._M_t.
                   super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                   .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
                  HadContextSensitiveCondition != false) {
                puVar12 = puVar12 + -2;
                goto LAB_004a8fb0;
              }
              if ((puVar12[-1]._M_t.
                   super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                   .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
                  HadContextSensitiveCondition != false) {
                puVar12 = puVar12 + -1;
                goto LAB_004a8fb0;
              }
              if (((puVar12->_M_t).
                   super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                   .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
                  HadContextSensitiveCondition != false) goto LAB_004a8fb0;
              if ((puVar12[1]._M_t.
                   super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                   .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
                  HadContextSensitiveCondition != false) {
                puVar12 = puVar12 + 1;
                goto LAB_004a8fb0;
              }
              lVar16 = lVar16 + -1;
              puVar12 = puVar12 + 4;
            } while (1 < lVar16);
          }
          lVar16 = (long)local_310.
                         super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)puVar11 >> 3;
          if (lVar16 == 1) {
LAB_004a8f8d:
            puVar12 = puVar11;
            if (((puVar11->_M_t).
                 super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                 .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
                HadContextSensitiveCondition == false) {
              puVar12 = local_310.
                        super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            }
          }
          else if (lVar16 == 2) {
LAB_004a8f7d:
            puVar12 = puVar11;
            if (((puVar11->_M_t).
                 super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                 .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
                HadContextSensitiveCondition == false) {
              puVar11 = puVar11 + 1;
              goto LAB_004a8f8d;
            }
          }
          else {
            puVar12 = local_310.
                      super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            if ((lVar16 == 3) &&
               (puVar12 = puVar11,
               ((puVar11->_M_t).
                super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                ._M_t.
                super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
               HadContextSensitiveCondition == false)) {
              puVar11 = puVar11 + 1;
              goto LAB_004a8f7d;
            }
          }
LAB_004a8fb0:
          bVar19 = puVar12 !=
                   local_310.
                   super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
      }
      p_Var8 = local_258._M_impl.super__Rb_tree_header._M_header._M_left;
      if (bVar19) {
        pcVar1 = (local_3d8->Type)._M_dataplus._M_p;
        sVar15 = (local_3d8->Type)._M_string_length;
        if (sVar15 == 0x17) {
          iVar5 = bcmp(pcVar1,"CXX_MODULE_HEADER_UNITS",0x17);
          p_Var8 = local_258._M_impl.super__Rb_tree_header._M_header._M_left;
        }
        else {
          if (sVar15 != 0xb) goto LAB_004a901c;
          iVar5 = bcmp(pcVar1,"CXX_MODULES",0xb);
          p_Var8 = local_258._M_impl.super__Rb_tree_header._M_header._M_left;
        }
        local_258._M_impl.super__Rb_tree_header._M_header._M_left = p_Var8;
        if (iVar5 != 0) goto LAB_004a901c;
        this_00 = local_270->IEGen->LocalGenerator->Makefile;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"The \"",5);
        psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(local_378);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_1a8,(psVar7->_M_dataplus)._M_p,
                            psVar7->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,"\" target\'s interface file set \"",0x1f);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,(local_3d8->Name)._M_dataplus._M_p,
                            (local_3d8->Name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\" of type \"",0xb);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,(pcVar3->Type)._M_dataplus._M_p,(pcVar3->Type)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,"\" contains context-sensitive base file entries which is not supported.",
                   0x46);
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(this_00,FATAL_ERROR,(string *)local_3d0);
        if ((_Base_ptr)local_3d0._0_8_ != (_Base_ptr)(local_3d0 + 0x10)) {
          operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
        }
        (local_380->_M_dataplus)._M_p = (pointer)local_278;
        local_380->_M_string_length = 0;
        (local_380->field_2)._M_local_buf[0] = '\0';
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        cVar13 = '\x01';
LAB_004a956c:
        bVar19 = false;
      }
      else {
LAB_004a901c:
        while ((_Rb_tree_header *)p_Var8 != &local_258._M_impl.super__Rb_tree_header) {
          if (p_Var8[1]._M_parent == (_Base_ptr)0x0) {
            local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0,"");
          }
          else {
            local_3d0._8_8_ = *(undefined8 *)(p_Var8 + 1);
            local_3d0._0_8_ = p_Var8[1]._M_parent;
            local_1a8._M_len = 1;
            local_3d0._24_8_ = &local_198;
            local_198._M_local_buf[0] = 0x2f;
            local_3d0._16_8_ = 1;
            views_00._M_len = 2;
            views_00._M_array = (iterator)local_3d0;
            local_1a8._M_str = (char *)local_3d0._24_8_;
            cmCatViews_abi_cxx11_(&local_3a0,views_00);
          }
          p_Var2 = p_Var8[2]._M_parent;
          local_260 = p_Var8;
          for (filename = *(_Base_ptr *)(p_Var8 + 2); sVar15 = local_3a0._M_string_length,
              _Var4._M_p = local_3a0._M_dataplus._M_p, filename != p_Var2; filename = filename + 1)
          {
            cmsys::SystemTools::GetFilenameName((string *)local_3d0,(string *)filename);
            local_1a8._M_len = sVar15;
            local_1a8._M_str = _Var4._M_p;
            local_198._M_allocated_capacity = local_3d0._8_8_;
            local_198._8_8_ = local_3d0._0_8_;
            views_01._M_len = 2;
            views_01._M_array = &local_1a8;
            cmCatViews_abi_cxx11_(&local_2f8,views_01);
            if ((_Base_ptr)local_3d0._0_8_ != (_Base_ptr)(local_3d0 + 0x10)) {
              operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
            }
            sVar15 = local_2d8._M_string_length;
            _Var4._M_p = local_2d8._M_dataplus._M_p;
            str_00._M_str = &DAT_00000001;
            str_00._M_len = (size_t)local_2f8._M_dataplus._M_p;
            cmOutputConverter::EscapeForCMake_abi_cxx11_
                      ((string *)local_3d0,(cmOutputConverter *)local_2f8._M_string_length,str_00,
                       (WrapQuotes)uVar18);
            local_1a8._M_len = sVar15;
            local_1a8._M_str = _Var4._M_p;
            local_198._M_allocated_capacity = local_3d0._8_8_;
            local_198._8_8_ = local_3d0._0_8_;
            views_02._M_len = 2;
            views_02._M_array = &local_1a8;
            cmCatViews_abi_cxx11_(&local_348,views_02);
            if ((_Base_ptr)local_3d0._0_8_ != (_Base_ptr)(local_3d0 + 0x10)) {
              operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
            }
            if ((bVar19) && ((long)local_358 - local_368._8_8_ != 0x20)) {
              local_198._8_8_ = (local_370->_M_dataplus)._M_p;
              local_198._M_allocated_capacity = local_370->_M_string_length;
              local_1a8._M_len = 0xc;
              local_1a8._M_str = "\"$<$<CONFIG:";
              local_188 = 2;
              local_180 = ">:";
              local_178 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_348._M_string_length;
              local_170 = local_348._M_dataplus._M_p;
              local_168 = 2;
              local_160 = ">\"";
              views_04._M_len = 5;
              views_04._M_array = &local_1a8;
              cmCatViews_abi_cxx11_((string *)local_3d0,views_04);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_328,(string *)local_3d0);
              sVar15 = local_3d0._16_8_;
              p_Var17 = (_Base_ptr)local_3d0._0_8_;
              if ((_Base_ptr)local_3d0._0_8_ != (_Base_ptr)(local_3d0 + 0x10)) {
LAB_004a9373:
                operator_delete(p_Var17,sVar15 + 1);
              }
            }
            else {
              local_2b8._M_dataplus._M_p = &DAT_00000001;
              local_2b8._M_string_length = (size_type)&local_2b8.field_2;
              local_2b8.field_2._M_local_buf[0] = '\"';
              local_1a8._M_len = 1;
              local_198._M_allocated_capacity = local_348._M_string_length;
              local_198._8_8_ = local_348._M_dataplus._M_p;
              local_3d0._0_8_ = &DAT_00000001;
              local_3d0._8_8_ = local_3d0 + 0x10;
              local_3d0[0x10] = 0x22;
              local_188 = 1;
              views_03._M_len = 3;
              views_03._M_array = &local_1a8;
              local_1a8._M_str = (char *)local_2b8._M_string_length;
              local_180 = (char *)local_3d0._8_8_;
              cmCatViews_abi_cxx11_((string *)local_200,views_03);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_328,(string *)local_200);
              sVar15 = local_200._16_8_;
              p_Var17 = (_Base_ptr)local_200._0_8_;
              if ((_Base_ptr)local_200._0_8_ != (_Base_ptr)(local_200 + 0x10)) goto LAB_004a9373;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_348._M_dataplus._M_p != &local_348.field_2) {
              operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
              operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
            operator_delete(local_3a0._M_dataplus._M_p,
                            CONCAT71(local_3a0.field_2._M_allocated_capacity._1_7_,
                                     local_3a0.field_2._M_local_buf[0]) + 1);
          }
          p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_260);
        }
        if (!bVar19) {
          cVar13 = '\x02';
          goto LAB_004a956c;
        }
        bVar20 = (long)local_358 - local_368._8_8_ == 0x20;
        bVar19 = !bVar20;
        cVar13 = bVar20 * '\x02';
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::~_Rb_tree(&local_258);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_1d0 + 2));
      if (!bVar19) goto LAB_004a95d2;
      psVar7 = local_370 + 1;
    } while (psVar7 != local_268);
    cVar13 = '\x02';
LAB_004a95d2:
    if (cVar13 != '\x02') goto LAB_004a95fb;
  }
  separator._M_str = " ";
  separator._M_len = 1;
  cmJoin(local_380,&local_328,separator,(string_view)ZEXT816(0));
LAB_004a95fb:
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               *)local_368);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_228);
  std::
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  ::~vector((vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
             *)(local_228 + 0x10));
  std::
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  ::~vector(&local_310);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_368 + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_328);
  return local_380;
}

Assistant:

std::string cmExportInstallFileGenerator::GetFileSetFiles(
  cmGeneratorTarget* gte, cmFileSet* fileSet, cmTargetExport* te)
{
  std::vector<std::string> resultVector;

  auto configs =
    gte->Makefile->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);

  auto fileEntries = fileSet->CompileFileEntries();
  auto directoryEntries = fileSet->CompileDirectoryEntries();

  cmGeneratorExpression destGe;
  auto destCge =
    destGe.Parse(te->FileSetGenerators.at(fileSet)->GetDestination());

  for (auto const& config : configs) {
    auto directories = fileSet->EvaluateDirectoryEntries(
      directoryEntries, gte->LocalGenerator, config, gte);

    std::map<std::string, std::vector<std::string>> files;
    for (auto const& entry : fileEntries) {
      fileSet->EvaluateFileEntry(directories, files, entry,
                                 gte->LocalGenerator, config, gte);
    }
    auto dest = cmStrCat("${_IMPORT_PREFIX}/",
                         cmOutputConverter::EscapeForCMake(
                           destCge->Evaluate(gte->LocalGenerator, config, gte),
                           cmOutputConverter::WrapQuotes::NoWrap),
                         '/');

    bool const contextSensitive = destCge->GetHadContextSensitiveCondition() ||
      std::any_of(directoryEntries.begin(), directoryEntries.end(),
                  EntryIsContextSensitive) ||
      std::any_of(fileEntries.begin(), fileEntries.end(),
                  EntryIsContextSensitive);

    auto const& type = fileSet->GetType();
    // C++ modules do not support interface file sets which are dependent upon
    // the configuration.
    if (contextSensitive &&
        (type == "CXX_MODULES"_s || type == "CXX_MODULE_HEADER_UNITS"_s)) {
      auto* mf = this->IEGen->GetLocalGenerator()->GetMakefile();
      std::ostringstream e;
      e << "The \"" << gte->GetName() << "\" target's interface file set \""
        << fileSet->GetName() << "\" of type \"" << type
        << "\" contains context-sensitive base file entries which is not "
           "supported.";
      mf->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return std::string{};
    }

    for (auto const& it : files) {
      auto prefix = it.first.empty() ? "" : cmStrCat(it.first, '/');
      for (auto const& filename : it.second) {
        auto relFile =
          cmStrCat(prefix, cmSystemTools::GetFilenameName(filename));
        auto escapedFile =
          cmStrCat(dest,
                   cmOutputConverter::EscapeForCMake(
                     relFile, cmOutputConverter::WrapQuotes::NoWrap));
        if (contextSensitive && configs.size() != 1) {
          resultVector.push_back(
            cmStrCat("\"$<$<CONFIG:", config, ">:", escapedFile, ">\""));
        } else {
          resultVector.push_back(cmStrCat('"', escapedFile, '"'));
        }
      }
    }

    if (!(contextSensitive && configs.size() != 1)) {
      break;
    }
  }

  return cmJoin(resultVector, " ");
}